

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O3

void * sx__malloc_leakd_cb(void *ptr,size_t size,uint32_t align,char *file,char *func,uint32_t line,
                          void *user_data)

{
  uint uVar1;
  code *pcVar2;
  void *pvVar3;
  uint8_t *aligned;
  anon_union_8_2_61bd4320 un;
  anon_union_8_2_61bd4320 un_1;
  size_t sz;
  ulong uVar4;
  void *pvVar5;
  void *in_stack_ffffffffffffffc8;
  
  if (size == 0) {
    if (ptr != (void *)0x0) {
      if (8 < align) {
        ptr = (void *)((long)ptr - (ulong)*(uint *)((long)ptr + -4));
      }
      stb_leakcheck_free(ptr);
    }
  }
  else {
    if (ptr == (void *)0x0) {
      if (align < 9) {
        pvVar3 = stb_leakcheck_malloc(size,file,func,line);
        return pvVar3;
      }
      uVar4 = 8;
      if (8 < (int)align) {
        uVar4 = (ulong)align;
      }
      sz = size + uVar4 + 4;
      if ((sz != 0) && (pvVar3 = stb_leakcheck_malloc(sz,file,func,line), pvVar3 != (void *)0x0)) {
        uVar4 = (ulong)((int)uVar4 - 1);
        pvVar5 = (void *)(~uVar4 & (long)pvVar3 + uVar4 + 4);
        *(int *)((long)pvVar5 + -4) = (int)pvVar5 - (int)pvVar3;
        return pvVar5;
      }
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                        ,0xb0,"ptr");
      pcVar2 = (code *)swi(3);
      pvVar3 = (void *)(*pcVar2)();
      return pvVar3;
    }
    if (8 < align) {
      uVar1 = *(uint *)((long)ptr + -4);
      uVar4 = 8;
      if (8 < (int)align) {
        uVar4 = (ulong)align;
      }
      pvVar3 = sx__malloc_leakd_cb((void *)((long)ptr - (ulong)uVar1),size + uVar4 + 4,0,file,func,
                                   line,in_stack_ffffffffffffffc8);
      if (pvVar3 != (void *)0x0) {
        uVar4 = (ulong)((int)uVar4 - 1);
        pvVar5 = (void *)(~uVar4 & (long)pvVar3 + uVar4 + 4);
        if (pvVar5 == ptr) {
          return ptr;
        }
        memmove(pvVar5,(void *)((ulong)uVar1 + (long)pvVar3),size);
        *(int *)((long)pvVar5 + -4) = (int)pvVar5 - (int)pvVar3;
        return pvVar5;
      }
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                        ,0xcd,"ptr");
      pcVar2 = (code *)swi(3);
      pvVar3 = (void *)(*pcVar2)();
      return pvVar3;
    }
    if (size <= *(ulong *)((long)ptr + -0x18)) {
      return ptr;
    }
    pvVar3 = stb_leakcheck_malloc(size,file,func,line);
    if (pvVar3 != (void *)0x0) {
      memcpy(pvVar3,ptr,*(size_t *)((long)ptr + -0x18));
      stb_leakcheck_free(ptr);
      return pvVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

static void* sx__malloc_leakd_cb(void* ptr, size_t size, uint32_t align, const char* file,
                                 const char* func, uint32_t line, void* user_data)
{
    sx_unused(user_data);
    if (size == 0) {
        if (ptr) {
            if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT) {
                stb_leakcheck_free(ptr);
                return NULL;
            }

            sx__aligned_free(&g_alloc_malloc_leakd, ptr, file, func, line);
        }
        return NULL;
    } else if (ptr == NULL) {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return stb_leakcheck_malloc(size, file, func, (int)line);

        return sx__aligned_alloc(&g_alloc_malloc_leakd, size, align, file, func, line);
    } else {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return stb_leakcheck_realloc(ptr, size, file, func, (int)line);

        return sx__aligned_realloc(&g_alloc_malloc_leakd, ptr, size, align, file, func, line);
    }
}